

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

void join_regions(chunk *c,int *colors,int *counts,_Bool allow_vault_disconnect)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = c->width * c->height;
  if ((int)uVar3 < 1) {
    iVar4 = 0;
  }
  else {
    uVar2 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (uint)(0 < counts[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  if (1 < iVar4) {
    do {
      uVar2 = 0xffffffff;
      if (0 < (int)uVar3) {
        uVar2 = 0;
        do {
          if (0 < counts[uVar2]) goto LAB_001498a9;
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
        uVar2 = 0xffffffff;
      }
LAB_001498a9:
      join_region(c,colors,counts,(wchar_t)uVar2,L'\xffffffff',allow_vault_disconnect);
      bVar1 = 2 < iVar4;
      iVar4 = iVar4 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

static void join_regions(struct chunk *c, int colors[], int counts[],
		bool allow_vault_disconnect) {
	int h = c->height;
	int w = c->width;
	int size = h * w;
	int num = count_colors(counts, size);

	/* While we have multiple colors (i.e. disconnected regions), join one
	 * of the regions to another one.
	 */
	while (num > 1) {
		int color = first_color(counts, size);
		join_region(c, colors, counts, color, -1,
			allow_vault_disconnect);
		num--;
	}
}